

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O2

bool __thiscall
embree::motion_derivative_regression_test::testMDC
          (motion_derivative_regression_test *this,MotionDerivativeCoefficients *mdc)

{
  float *pfVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int dim;
  int dim_00;
  Vec3fa *p1_00;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Interval1f interval;
  Vec3fa p1;
  Vec3fa p0;
  MotionDerivative md;
  float roots [32];
  
  if (NAN(mdc->theta)) {
    return false;
  }
  lVar4 = 1;
  while (lVar4 != 0xa9) {
    lVar2 = lVar4 + -1;
    lVar4 = lVar4 + 1;
    if (NAN(mdc->coeffs[lVar2])) {
      return false;
    }
  }
  uVar6 = 0;
  do {
    if (uVar6 == 0x20) {
      return true;
    }
    fVar7 = rand01(this);
    fVar8 = rand01(this);
    fVar9 = rand01(this);
    p0.field_0.m128[1] = fVar8 * 20.0 + -10.0;
    p0.field_0.m128[0] = fVar7 * 20.0 + -10.0;
    p0.field_0.m128[2] = fVar9 * 20.0 + -10.0;
    p0.field_0.m128[3] = 0.0;
    fVar7 = rand01(this);
    fVar8 = rand01(this);
    fVar9 = rand01(this);
    p1.field_0.m128[1] = fVar8 * 20.0 + -10.0;
    p1.field_0.m128[0] = fVar7 * 20.0 + -10.0;
    p1.field_0.m128[2] = fVar9 * 20.0 + -10.0;
    p1.field_0.m128[3] = 0.0;
    fVar7 = rand01(this);
    for (dim_00 = 0; dim_00 != 3; dim_00 = dim_00 + 1) {
      fVar8 = rand01(this);
      p1_00 = &p0;
      if (0.5 < fVar8) {
        p1_00 = &p1;
      }
      MotionDerivative::MotionDerivative(&md,mdc,dim_00,&p0,p1_00);
      fVar8 = rand01(this);
      fVar8 = fVar8 + fVar8 + -1.0;
      fVar9 = rand01(this);
      interval.lower = fVar8;
      interval.upper = fVar9 + fVar8;
      uVar3 = MotionDerivative::findRoots(&md,&interval,fVar7 * 20.0 + -10.0,roots,0x20);
      if (0x1f < uVar3) {
LAB_0026b15f:
        return 0x1f < uVar6;
      }
      uVar5 = 0;
      while (uVar3 != uVar5) {
        pfVar1 = roots + uVar5;
        if ((*pfVar1 < fVar8) || (uVar5 = uVar5 + 1, fVar9 + fVar8 < *pfVar1)) goto LAB_0026b15f;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool testMDC(MotionDerivativeCoefficients const& mdc)
    {
      if (!valid(mdc.theta)) return false;
      for (int i = 0; i < 3*8*7; ++i)
      {
        if(!valid(mdc.coeffs[i])) return false;
      }

      unsigned int maxNumRoots = 32;
      float roots[32];
      for (int j = 0; j < 32; ++j)
      {
        Vec3fa p0(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
        Vec3fa p1(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
        float offset = 20.f * rand01() - 10.f;

        for (int dim = 0; dim < 3; ++dim) {
          MotionDerivative md(mdc, dim, p0, rand01() > 0.5f ? p1 : p0);
          float tmin = 2.f * rand01() - 1.f;
          float tmax = tmin + rand01();
          Interval1f interval(tmin, tmax);
          unsigned int num_roots = md.findRoots(interval, offset, roots, maxNumRoots);
          if (num_roots >= maxNumRoots) {
            return false;
          }
          for (unsigned int i = 0; i < min(num_roots, maxNumRoots); ++i) {
            if(!valid(roots[i])) return false;
            if(!(roots[i] >= tmin && roots[i] <= tmax)) return false;
          }
        }
      }

      return true;
    }